

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStepInnerStepper_Resize
              (MRIStepInnerStepper stepper,ARKVecResizeFn resize,void *resize_data,
              sunindextype lrw_diff,sunindextype liw_diff,N_Vector tmpl)

{
  int iVar1;
  int iVar2;
  
  if (stepper != (MRIStepInnerStepper)0x0) {
    iVar1 = arkResizeVecArray(resize,resize_data,stepper->nforcing_allocated,tmpl,&stepper->forcing,
                              lrw_diff,&stepper->lrw,liw_diff,&stepper->liw);
    iVar2 = -0x14;
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    return iVar2;
  }
  return -0x16;
}

Assistant:

int mriStepInnerStepper_Resize(MRIStepInnerStepper stepper, ARKVecResizeFn resize,
                               void* resize_data, sunindextype lrw_diff,
                               sunindextype liw_diff, N_Vector tmpl)
{
  int retval;

  if (stepper == NULL) { return ARK_ILL_INPUT; }

  retval = arkResizeVecArray(resize, resize_data, stepper->nforcing_allocated,
                             tmpl, &(stepper->forcing), lrw_diff,
                             &(stepper->lrw), liw_diff, &(stepper->liw));
  if (retval != ARK_SUCCESS) { return (ARK_MEM_FAIL); }

  return (ARK_SUCCESS);
}